

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall
QAbstractScrollArea::setHorizontalScrollBarPolicy(QAbstractScrollArea *this,ScrollBarPolicy policy)

{
  bool bVar1;
  QAbstractScrollAreaPrivate *pQVar2;
  ScrollBarPolicy in_ESI;
  ScrollBarPolicy oldPolicy;
  QAbstractScrollAreaPrivate *d;
  undefined4 in_stack_ffffffffffffffe0;
  ScrollBarPolicy SVar3;
  
  pQVar2 = d_func((QAbstractScrollArea *)0x497b0f);
  SVar3 = pQVar2->hbarpolicy;
  pQVar2->hbarpolicy = in_ESI;
  bVar1 = QWidget::isVisible((QWidget *)0x497b3b);
  if (bVar1) {
    QAbstractScrollAreaPrivate::layoutChildren
              ((QAbstractScrollAreaPrivate *)CONCAT44(SVar3,in_stack_ffffffffffffffe0));
  }
  if (SVar3 != pQVar2->hbarpolicy) {
    (**(code **)(*(long *)&(pQVar2->super_QFramePrivate).super_QWidgetPrivate + 0xa8))
              (pQVar2,1,pQVar2->hbarpolicy);
  }
  return;
}

Assistant:

void QAbstractScrollArea::setHorizontalScrollBarPolicy(Qt::ScrollBarPolicy policy)
{
    Q_D(QAbstractScrollArea);
    const Qt::ScrollBarPolicy oldPolicy = d->hbarpolicy;
    d->hbarpolicy = policy;
    if (isVisible())
        d->layoutChildren();
    if (oldPolicy != d->hbarpolicy)
        d->scrollBarPolicyChanged(Qt::Horizontal, d->hbarpolicy);
}